

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  j_compress_ptr in_RSI;
  long in_RDI;
  int v;
  int kex;
  int ke;
  int k;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr entropy;
  int local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  jpeg_error_mgr *pjVar4;
  int val;
  uchar *st_00;
  
  st_00 = *(uchar **)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(st_00 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      *(undefined4 *)(st_00 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(st_00 + 100) = *(int *)(st_00 + 100) + 1;
      *(uint *)(st_00 + 100) = *(uint *)(st_00 + 100) & 7;
    }
    *(int *)(st_00 + 0x60) = *(int *)(st_00 + 0x60) + -1;
  }
  pjVar4 = in_RSI->err;
  for (iVar2 = *(int *)(in_RDI + 0x1a0); local_38 = iVar2, 0 < iVar2; iVar2 = iVar2 + -1) {
    iVar1 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[iVar2] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    if (iVar1 != 0) break;
  }
  do {
    if (local_38 < 1) break;
    iVar1 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[local_38] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a4) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a4) & 0x1f);
    }
    if (iVar1 != 0) break;
    local_38 = local_38 + -1;
  } while( true );
  iVar1 = *(int *)(in_RDI + 0x19c);
LAB_0014e8f9:
  iVar3 = (int)((ulong)pjVar4 >> 0x20);
  if (iVar2 < iVar1) {
    if (iVar1 <= *(int *)(in_RDI + 0x1a0)) {
      arith_encode(in_RSI,st_00,iVar3);
    }
    return 1;
  }
  if (local_38 < iVar1) {
    arith_encode(in_RSI,st_00,iVar3);
  }
  do {
    iVar3 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[iVar1] * 2);
    val = (int)((ulong)pjVar4 >> 0x20);
    if (iVar3 < 0) {
      iVar3 = -iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (iVar3 != 0) break;
    }
    else {
      iVar3 = iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (iVar3 != 0) {
        if (iVar3 >> 1 == 0) {
          arith_encode(in_RSI,st_00,val);
          arith_encode(in_RSI,st_00,(int)((ulong)pjVar4 >> 0x20));
        }
        else {
          arith_encode(in_RSI,st_00,val);
        }
        goto LAB_0014ea9d;
      }
    }
    arith_encode(in_RSI,st_00,val);
    iVar1 = iVar1 + 1;
  } while( true );
  if (iVar3 >> 1 == 0) {
    arith_encode(in_RSI,st_00,val);
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar4 >> 0x20));
  }
  else {
    arith_encode(in_RSI,st_00,val);
  }
LAB_0014ea9d:
  iVar1 = iVar1 + 1;
  goto LAB_0014e8f9;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[jpeg_natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);       /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 0);
          }
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 1);
          }
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}